

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O1

REF_STATUS ref_acceptance_pd(REF_NODE ref_node,char *function_name,REF_INT *ldim,REF_DBL **scalar)

{
  bool bVar1;
  int iVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  REF_DBL primitive [5];
  REF_DBL dual [5];
  uint local_8c;
  REF_DBL local_88 [6];
  REF_DBL local_58 [5];
  
  *ldim = 10;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0x1e5,"ref_acceptance_pd","malloc *scalar of REF_DBL negative");
    local_8c = 1;
  }
  else {
    pRVar5 = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x50);
    *scalar = pRVar5;
    if (pRVar5 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
             0x1e5,"ref_acceptance_pd","malloc *scalar of REF_DBL NULL");
      local_8c = 2;
    }
    else {
      if (0 < ref_node->max) {
        lVar8 = 0;
        do {
          if (-1 < ref_node->global[lVar8]) {
            iVar2 = strcmp(function_name,"trig");
            iVar7 = (int)lVar8;
            if (iVar2 == 0) {
              ref_acceptance_primal_trig
                        (ref_node->real[lVar8 * 0xf],ref_node->real[lVar8 * 0xf + 1],local_88);
              uVar4 = ref_phys_entropy_adjoint(local_88,local_58);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,0x1ee,"ref_acceptance_pd",(ulong)uVar4,"entropy adj");
                return uVar4;
              }
              iVar2 = *ldim;
              pRVar5 = *scalar;
              lVar6 = 0;
              do {
                pRVar5[(long)iVar2 * (long)iVar7 + lVar6] = local_88[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 5);
              pRVar5 = *scalar;
              iVar2 = *ldim;
              lVar6 = 0;
              do {
                pRVar5[(long)iVar2 * (long)iVar7 + lVar6 + 5] = local_58[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 5);
            }
            else {
              iVar2 = strcmp(function_name,"vortex");
              if (iVar2 == 0) {
                ref_acceptance_primal_vortex
                          (ref_node->real[lVar8 * 0xf],ref_node->real[lVar8 * 0xf + 1],local_88);
                uVar4 = ref_phys_entropy_adjoint(local_88,local_58);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x1f7,"ref_acceptance_pd",(ulong)uVar4,"entropy adj");
                  return uVar4;
                }
                iVar2 = *ldim;
                pRVar5 = *scalar;
                lVar6 = 0;
                do {
                  pRVar5[(long)iVar2 * (long)iVar7 + lVar6] = local_88[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 5);
                pRVar5 = *scalar;
                iVar2 = *ldim;
                lVar6 = 0;
                do {
                  pRVar5[(long)iVar2 * (long)iVar7 + lVar6 + 5] = local_58[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 5);
              }
              else {
                iVar2 = strcmp(function_name,"coax");
                if (iVar2 == 0) {
                  ref_acceptance_primal_coax
                            (ref_node->real[lVar8 * 0xf],ref_node->real[lVar8 * 0xf + 1],local_88);
                  uVar4 = ref_phys_entropy_adjoint(local_88,local_58);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                           ,0x200,"ref_acceptance_pd",(ulong)uVar4,"entropy adj");
                    return uVar4;
                  }
                  iVar2 = *ldim;
                  pRVar5 = *scalar;
                  lVar6 = 0;
                  do {
                    pRVar5[(long)iVar2 * (long)iVar7 + lVar6] = local_88[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 5);
                  pRVar5 = *scalar;
                  iVar2 = *ldim;
                  lVar6 = 0;
                  do {
                    pRVar5[(long)iVar2 * (long)iVar7 + lVar6 + 5] = local_58[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 5);
                }
                else {
                  iVar2 = strcmp(function_name,"ringleb");
                  if (iVar2 != 0) {
                    printf("%s: %d: %s %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                           ,0x20d,"unknown user function",function_name);
                    return 5;
                  }
                  RVar3 = ref_acceptance_primal_ringleb
                                    (ref_node->real[lVar8 * 0xf],ref_node->real[lVar8 * 0xf + 1],
                                     local_88);
                  if (RVar3 == 0) {
                    uVar4 = ref_phys_entropy_adjoint(local_88,local_58);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                             ,0x209,"ref_acceptance_pd",(ulong)uVar4,"entropy adj");
                      local_8c = uVar4;
                      goto LAB_00111308;
                    }
                    iVar2 = *ldim;
                    pRVar5 = *scalar;
                    lVar6 = 0;
                    do {
                      pRVar5[(long)iVar2 * (long)iVar7 + lVar6] = local_88[lVar6];
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 5);
                    pRVar5 = *scalar;
                    iVar2 = *ldim;
                    lVar6 = 0;
                    do {
                      pRVar5[(long)iVar2 * (long)iVar7 + lVar6 + 5] = local_58[lVar6];
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 5);
                    bVar1 = true;
                  }
                  else {
                    local_8c = 1;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                           ,0x208,"ref_acceptance_pd",1,"ringleb");
LAB_00111308:
                    bVar1 = false;
                  }
                  if (!bVar1) {
                    return local_8c;
                  }
                }
              }
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < ref_node->max);
      }
      local_8c = 0;
    }
  }
  return local_8c;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_pd(REF_NODE ref_node,
                                            const char *function_name,
                                            REF_INT *ldim, REF_DBL **scalar) {
  REF_INT node, i;
  *ldim = 10;
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(function_name, "trig") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "trig");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "vortex") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_vortex(ref_node_xyz(ref_node, 0, node),
                                       ref_node_xyz(ref_node, 1, node),
                                       primitive),
          "vortex");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "coax") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_coax(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "ringleb") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_ringleb(ref_node_xyz(ref_node, 0, node),
                                        ref_node_xyz(ref_node, 1, node),
                                        primitive),
          "ringleb");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}